

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<4,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Scene *pSVar5;
  Geometry *pGVar6;
  RTCIntersectArguments *pRVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  byte bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  uint uVar31;
  byte bVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar56;
  StackItemT<embree::NodeRefPtr<4>_> SVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined4 uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  int local_116c;
  ulong local_1168;
  ulong local_1160;
  ulong local_1158;
  StackItemT<embree::NodeRefPtr<4>_> *local_1150;
  long local_1148;
  long local_1140;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_1088;
  vfloat<4> tNear;
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  float local_fd8 [4];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong uVar32;
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_1150 = stack + 1;
    stack[0].dist = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar53 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar96 = (ray->super_RayK<1>).tfar;
    auVar84 = ZEXT464((uint)fVar96);
    auVar44._8_4_ = 0x7fffffff;
    auVar44._0_8_ = 0x7fffffff7fffffff;
    auVar44._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx512vl((undefined1  [16])aVar2,auVar44);
    auVar45._8_4_ = 0x219392ef;
    auVar45._0_8_ = 0x219392ef219392ef;
    auVar45._12_4_ = 0x219392ef;
    uVar39 = vcmpps_avx512vl(auVar44,auVar45,1);
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar105 = ZEXT1664(auVar44);
    auVar44 = vdivps_avx512vl(auVar44,(undefined1  [16])aVar2);
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar8 = (bool)((byte)uVar39 & 1);
    auVar48._0_4_ = (uint)bVar8 * auVar45._0_4_ | (uint)!bVar8 * auVar44._0_4_;
    bVar8 = (bool)((byte)(uVar39 >> 1) & 1);
    auVar48._4_4_ = (uint)bVar8 * auVar45._4_4_ | (uint)!bVar8 * auVar44._4_4_;
    bVar8 = (bool)((byte)(uVar39 >> 2) & 1);
    auVar48._8_4_ = (uint)bVar8 * auVar45._8_4_ | (uint)!bVar8 * auVar44._8_4_;
    bVar8 = (bool)((byte)(uVar39 >> 3) & 1);
    auVar48._12_4_ = (uint)bVar8 * auVar45._12_4_ | (uint)!bVar8 * auVar44._12_4_;
    auVar54._8_4_ = 0x3f7ffffa;
    auVar54._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar54._12_4_ = 0x3f7ffffa;
    auVar46 = vmulps_avx512vl(auVar48,auVar54);
    auVar47._8_4_ = 0x3f800003;
    auVar47._0_8_ = 0x3f8000033f800003;
    auVar47._12_4_ = 0x3f800003;
    auVar47 = vmulps_avx512vl(auVar48,auVar47);
    auVar48 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar96));
    auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar51 = vbroadcastss_avx512vl(auVar46);
    auVar45 = vmovshdup_avx(auVar46);
    auVar52 = vshufps_avx512vl(auVar46,auVar46,0x55);
    auVar54 = vshufpd_avx(auVar46,auVar46,1);
    local_f88 = vshufps_avx(auVar46,auVar46,0xaa);
    auVar93 = ZEXT1664(local_f88);
    fVar76 = auVar47._0_4_;
    local_fa8 = vshufps_avx(auVar47,auVar47,0x55);
    auVar99 = ZEXT1664(local_fa8);
    local_fb8 = vshufps_avx(auVar47,auVar47,0xaa);
    auVar103 = ZEXT1664(local_fb8);
    uVar39 = (ulong)(auVar46._0_4_ < 0.0) << 4;
    uVar40 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x20;
    uVar41 = (ulong)(auVar54._0_4_ < 0.0) << 4 | 0x40;
    uVar42 = uVar39 ^ 0x10;
    uVar35 = uVar40 ^ 0x10;
    uVar85 = auVar53._0_4_;
    local_fc8._4_4_ = uVar85;
    local_fc8._0_4_ = uVar85;
    local_fc8._8_4_ = uVar85;
    local_fc8._12_4_ = uVar85;
    auVar104 = ZEXT1664(local_fc8);
    uVar85 = auVar44._0_4_;
    auVar83 = ZEXT1664(CONCAT412(uVar85,CONCAT48(uVar85,CONCAT44(uVar85,uVar85))));
    local_1160 = uVar39;
    local_1168 = uVar40;
    local_f98 = fVar76;
    fStack_f94 = fVar76;
    fStack_f90 = fVar76;
    fStack_f8c = fVar76;
    fVar96 = fVar76;
    fVar97 = fVar76;
    fVar98 = fVar76;
LAB_01bd953c:
    if (local_1150 != stack) {
      pSVar29 = local_1150 + -1;
      local_1150 = local_1150 + -1;
      if ((float)pSVar29->dist <= auVar84._0_4_) {
        uVar43 = (local_1150->ptr).ptr;
        while ((uVar43 & 8) == 0) {
          uVar30 = uVar43 & 0xfffffffffffffff0;
          uVar85 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar46._4_4_ = uVar85;
          auVar46._0_4_ = uVar85;
          auVar46._8_4_ = uVar85;
          auVar46._12_4_ = uVar85;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar39),auVar46,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + uVar39));
          auVar53 = vsubps_avx512vl(auVar53,auVar48);
          auVar53 = vmulps_avx512vl(auVar51,auVar53);
          auVar53 = vmaxps_avx(auVar104._0_16_,auVar53);
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar40),auVar46,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + uVar40));
          auVar44 = vsubps_avx512vl(auVar44,auVar49);
          auVar45 = vmulps_avx512vl(auVar52,auVar44);
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar41),auVar46,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + uVar41));
          auVar44 = vsubps_avx512vl(auVar44,auVar50);
          auVar64._0_4_ = auVar93._0_4_ * auVar44._0_4_;
          auVar64._4_4_ = auVar93._4_4_ * auVar44._4_4_;
          auVar64._8_4_ = auVar93._8_4_ * auVar44._8_4_;
          auVar64._12_4_ = auVar93._12_4_ * auVar44._12_4_;
          auVar44 = vmaxps_avx(auVar45,auVar64);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vmaxps_avx(auVar53,auVar44)
          ;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar42),auVar46,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + uVar42));
          auVar53 = vsubps_avx512vl(auVar53,auVar48);
          auVar63._0_4_ = fVar76 * auVar53._0_4_;
          auVar63._4_4_ = fVar96 * auVar53._4_4_;
          auVar63._8_4_ = fVar97 * auVar53._8_4_;
          auVar63._12_4_ = fVar98 * auVar53._12_4_;
          auVar53 = vminps_avx(auVar83._0_16_,auVar63);
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + uVar35),auVar46,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + uVar35));
          auVar44 = vsubps_avx512vl(auVar44,auVar49);
          auVar65._0_4_ = auVar99._0_4_ * auVar44._0_4_;
          auVar65._4_4_ = auVar99._4_4_ * auVar44._4_4_;
          auVar65._8_4_ = auVar99._8_4_ * auVar44._8_4_;
          auVar65._12_4_ = auVar99._12_4_ * auVar44._12_4_;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar30 + 0x80 + (uVar41 ^ 0x10)),auVar46,
                                    *(undefined1 (*) [16])(uVar30 + 0x20 + (uVar41 ^ 0x10)));
          auVar44 = vsubps_avx512vl(auVar44,auVar50);
          auVar58._0_4_ = auVar103._0_4_ * auVar44._0_4_;
          auVar58._4_4_ = auVar103._4_4_ * auVar44._4_4_;
          auVar58._8_4_ = auVar103._8_4_ * auVar44._8_4_;
          auVar58._12_4_ = auVar103._12_4_ * auVar44._12_4_;
          auVar44 = vminps_avx(auVar65,auVar58);
          auVar53 = vminps_avx(auVar53,auVar44);
          uVar16 = vcmpps_avx512vl((undefined1  [16])tNear.field_0,auVar53,2);
          uVar31 = (uint)uVar16;
          if (((uint)uVar43 & 7) == 6) {
            uVar17 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [16])(uVar30 + 0xf0),1);
            uVar18 = vcmpps_avx512vl(auVar46,*(undefined1 (*) [16])(uVar30 + 0xe0),0xd);
            uVar31 = (uint)(byte)((byte)uVar17 & (byte)uVar18 & (byte)uVar16);
          }
          if ((byte)uVar31 == 0) {
            auVar53 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar84 = ZEXT1664(auVar53);
            goto LAB_01bd953c;
          }
          lVar38 = 0;
          for (uVar43 = (ulong)(byte)uVar31; (uVar43 & 1) == 0;
              uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar43 = *(ulong *)(uVar30 + lVar38 * 8);
          uVar31 = (uVar31 & 0xff) - 1 & uVar31 & 0xff;
          uVar32 = (ulong)uVar31;
          if (uVar31 != 0) {
            uVar34 = tNear.field_0.i[lVar38];
            lVar38 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
            uVar31 = uVar31 - 1 & uVar31;
            uVar37 = (ulong)uVar31;
            uVar32 = *(ulong *)(uVar30 + lVar38 * 8);
            uVar36 = tNear.field_0.i[lVar38];
            if (uVar31 == 0) {
              if (uVar34 < uVar36) {
                (local_1150->ptr).ptr = uVar32;
                local_1150->dist = uVar36;
                local_1150 = local_1150 + 1;
              }
              else {
                (local_1150->ptr).ptr = uVar43;
                local_1150->dist = uVar34;
                uVar43 = uVar32;
                local_1150 = local_1150 + 1;
              }
            }
            else {
              auVar53._8_8_ = 0;
              auVar53._0_8_ = uVar43;
              auVar53 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar34));
              auVar59._8_8_ = 0;
              auVar59._0_8_ = uVar32;
              auVar44 = vpunpcklqdq_avx(auVar59,ZEXT416(uVar36));
              lVar38 = 0;
              for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                lVar38 = lVar38 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              uVar43 = (ulong)uVar31;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(uVar30 + lVar38 * 8);
              auVar46 = vpunpcklqdq_avx(auVar60,ZEXT416((uint)tNear.field_0.i[lVar38]));
              auVar45 = vpshufd_avx(auVar53,0xaa);
              auVar54 = vpshufd_avx(auVar44,0xaa);
              auVar47 = vpshufd_avx(auVar46,0xaa);
              if (uVar31 == 0) {
                uVar43 = vpcmpgtd_avx512vl(auVar54,auVar45);
                uVar43 = uVar43 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar44,auVar53);
                bVar8 = (bool)((byte)uVar43 & 1);
                auVar72._0_4_ = (uint)bVar8 * auVar54._0_4_ | (uint)!bVar8 * auVar45._0_4_;
                bVar8 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar72._4_4_ = (uint)bVar8 * auVar54._4_4_ | (uint)!bVar8 * auVar45._4_4_;
                bVar8 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar72._8_4_ = (uint)bVar8 * auVar54._8_4_ | (uint)!bVar8 * auVar45._8_4_;
                bVar8 = SUB81(uVar43 >> 3,0);
                auVar72._12_4_ = (uint)bVar8 * auVar54._12_4_ | (uint)!bVar8 * auVar45._12_4_;
                auVar44 = vmovdqa32_avx512vl(auVar44);
                bVar8 = (bool)((byte)uVar43 & 1);
                auVar73._0_4_ = (uint)bVar8 * auVar44._0_4_ | (uint)!bVar8 * auVar53._0_4_;
                bVar8 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar73._4_4_ = (uint)bVar8 * auVar44._4_4_ | (uint)!bVar8 * auVar53._4_4_;
                bVar8 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar73._8_4_ = (uint)bVar8 * auVar44._8_4_ | (uint)!bVar8 * auVar53._8_4_;
                bVar8 = SUB81(uVar43 >> 3,0);
                auVar73._12_4_ = (uint)bVar8 * auVar44._12_4_ | (uint)!bVar8 * auVar53._12_4_;
                auVar53 = vpshufd_avx(auVar72,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar47,auVar53);
                uVar30 = uVar30 & 0xf;
                auVar44 = vpblendmd_avx512vl(auVar46,auVar72);
                bVar8 = (bool)((byte)uVar30 & 1);
                bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar43 = CONCAT44((uint)bVar9 * auVar44._4_4_ | (uint)!bVar9 * auVar53._4_4_,
                                  (uint)bVar8 * auVar44._0_4_ | (uint)!bVar8 * auVar53._0_4_);
                auVar53 = vmovdqa32_avx512vl(auVar46);
                bVar8 = (bool)((byte)uVar30 & 1);
                auVar55._0_4_ = (uint)bVar8 * auVar53._0_4_ | !bVar8 * auVar72._0_4_;
                bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar55._4_4_ = (uint)bVar8 * auVar53._4_4_ | !bVar8 * auVar72._4_4_;
                bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar55._8_4_ = (uint)bVar8 * auVar53._8_4_ | !bVar8 * auVar72._8_4_;
                bVar8 = SUB81(uVar30 >> 3,0);
                auVar55._12_4_ = (uint)bVar8 * auVar53._12_4_ | !bVar8 * auVar72._12_4_;
                auVar53 = vpshufd_avx(auVar55,0xaa);
                auVar44 = vpshufd_avx(auVar73,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar53,auVar44);
                uVar30 = uVar30 & 0xf;
                auVar44 = vpblendmd_avx512vl(auVar55,auVar73);
                bVar8 = (bool)((byte)uVar30 & 1);
                bVar10 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar12 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar14 = SUB81(uVar30 >> 3,0);
                auVar45 = vmovdqa32_avx512vl(auVar55);
                bVar9 = (bool)((byte)uVar30 & 1);
                bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
                bVar13 = (bool)((byte)(uVar30 >> 2) & 1);
                bVar15 = SUB81(uVar30 >> 3,0);
                *(uint *)&(local_1150->ptr).ptr =
                     (uint)bVar9 * auVar45._0_4_ | !bVar9 * auVar73._0_4_;
                *(uint *)((long)&(local_1150->ptr).ptr + 4) =
                     (uint)bVar11 * auVar45._4_4_ | !bVar11 * auVar73._4_4_;
                local_1150->dist = (uint)bVar13 * auVar45._8_4_ | !bVar13 * auVar73._8_4_;
                *(uint *)&local_1150->field_0xc =
                     (uint)bVar15 * auVar45._12_4_ | !bVar15 * auVar73._12_4_;
                *(uint *)&local_1150[1].ptr.ptr =
                     (uint)bVar8 * auVar44._0_4_ | (uint)!bVar8 * auVar53._0_4_;
                *(uint *)((long)&local_1150[1].ptr.ptr + 4) =
                     (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar53._4_4_;
                local_1150[1].dist = (uint)bVar12 * auVar44._8_4_ | (uint)!bVar12 * auVar53._8_4_;
                *(uint *)&local_1150[1].field_0xc =
                     (uint)bVar14 * auVar44._12_4_ | (uint)!bVar14 * auVar53._12_4_;
                local_1150 = local_1150 + 2;
              }
              else {
                lVar38 = 0;
                for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                  lVar38 = lVar38 + 1;
                }
                uVar31 = tNear.field_0.i[lVar38];
                auVar71._8_8_ = 0;
                auVar71._0_8_ = *(ulong *)(uVar30 + lVar38 * 8);
                auVar63 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar31));
                uVar43 = vpcmpgtd_avx512vl(auVar54,auVar45);
                uVar43 = uVar43 & 0xf;
                auVar54 = vpblendmd_avx512vl(auVar44,auVar53);
                bVar8 = (bool)((byte)uVar43 & 1);
                auVar61._0_4_ = (uint)bVar8 * auVar54._0_4_ | (uint)!bVar8 * auVar45._0_4_;
                bVar8 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar61._4_4_ = (uint)bVar8 * auVar54._4_4_ | (uint)!bVar8 * auVar45._4_4_;
                bVar8 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar61._8_4_ = (uint)bVar8 * auVar54._8_4_ | (uint)!bVar8 * auVar45._8_4_;
                bVar8 = SUB81(uVar43 >> 3,0);
                auVar61._12_4_ = (uint)bVar8 * auVar54._12_4_ | (uint)!bVar8 * auVar45._12_4_;
                auVar44 = vmovdqa32_avx512vl(auVar44);
                bVar8 = (bool)((byte)uVar43 & 1);
                auVar62._0_4_ = (uint)bVar8 * auVar44._0_4_ | (uint)!bVar8 * auVar53._0_4_;
                bVar8 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar62._4_4_ = (uint)bVar8 * auVar44._4_4_ | (uint)!bVar8 * auVar53._4_4_;
                bVar8 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar62._8_4_ = (uint)bVar8 * auVar44._8_4_ | (uint)!bVar8 * auVar53._8_4_;
                bVar8 = SUB81(uVar43 >> 3,0);
                auVar62._12_4_ = (uint)bVar8 * auVar44._12_4_ | (uint)!bVar8 * auVar53._12_4_;
                auVar70._4_4_ = uVar31;
                auVar70._0_4_ = uVar31;
                auVar70._8_4_ = uVar31;
                auVar70._12_4_ = uVar31;
                uVar43 = vpcmpgtd_avx512vl(auVar70,auVar47);
                uVar43 = uVar43 & 0xf;
                auVar53 = vpblendmd_avx512vl(auVar63,auVar46);
                bVar8 = (bool)((byte)uVar43 & 1);
                auVar66._0_4_ = (uint)bVar8 * auVar53._0_4_ | !bVar8 * uVar31;
                bVar8 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar8 * auVar53._4_4_ | !bVar8 * uVar31;
                bVar8 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar8 * auVar53._8_4_ | !bVar8 * uVar31;
                bVar8 = SUB81(uVar43 >> 3,0);
                auVar66._12_4_ = (uint)bVar8 * auVar53._12_4_ | !bVar8 * uVar31;
                auVar53 = vmovdqa32_avx512vl(auVar63);
                bVar8 = (bool)((byte)uVar43 & 1);
                auVar67._0_4_ = (uint)bVar8 * auVar53._0_4_ | (uint)!bVar8 * auVar46._0_4_;
                bVar8 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar67._4_4_ = (uint)bVar8 * auVar53._4_4_ | (uint)!bVar8 * auVar46._4_4_;
                bVar8 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar67._8_4_ = (uint)bVar8 * auVar53._8_4_ | (uint)!bVar8 * auVar46._8_4_;
                bVar8 = SUB81(uVar43 >> 3,0);
                auVar67._12_4_ = (uint)bVar8 * auVar53._12_4_ | (uint)!bVar8 * auVar46._12_4_;
                auVar53 = vpshufd_avx(auVar67,0xaa);
                auVar44 = vpshufd_avx(auVar62,0xaa);
                uVar43 = vpcmpgtd_avx512vl(auVar53,auVar44);
                uVar43 = uVar43 & 0xf;
                auVar44 = vpblendmd_avx512vl(auVar67,auVar62);
                bVar8 = (bool)((byte)uVar43 & 1);
                auVar68._0_4_ = (uint)bVar8 * auVar44._0_4_ | (uint)!bVar8 * auVar53._0_4_;
                bVar8 = (bool)((byte)(uVar43 >> 1) & 1);
                auVar68._4_4_ = (uint)bVar8 * auVar44._4_4_ | (uint)!bVar8 * auVar53._4_4_;
                bVar8 = (bool)((byte)(uVar43 >> 2) & 1);
                auVar68._8_4_ = (uint)bVar8 * auVar44._8_4_ | (uint)!bVar8 * auVar53._8_4_;
                bVar8 = SUB81(uVar43 >> 3,0);
                auVar68._12_4_ = (uint)bVar8 * auVar44._12_4_ | (uint)!bVar8 * auVar53._12_4_;
                auVar45 = vmovdqa32_avx512vl(auVar67);
                bVar8 = (bool)((byte)uVar43 & 1);
                bVar10 = (bool)((byte)(uVar43 >> 1) & 1);
                bVar12 = (bool)((byte)(uVar43 >> 2) & 1);
                bVar13 = SUB81(uVar43 >> 3,0);
                auVar53 = vpshufd_avx(auVar66,0xaa);
                auVar44 = vpshufd_avx(auVar61,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar53,auVar44);
                uVar30 = uVar30 & 0xf;
                auVar44 = vpblendmd_avx512vl(auVar66,auVar61);
                bVar9 = (bool)((byte)uVar30 & 1);
                bVar11 = (bool)((byte)(uVar30 >> 1) & 1);
                uVar43 = CONCAT44((uint)bVar11 * auVar44._4_4_ | (uint)!bVar11 * auVar53._4_4_,
                                  (uint)bVar9 * auVar44._0_4_ | (uint)!bVar9 * auVar53._0_4_);
                auVar53 = vmovdqa32_avx512vl(auVar66);
                bVar9 = (bool)((byte)uVar30 & 1);
                auVar69._0_4_ = (uint)bVar9 * auVar53._0_4_ | !bVar9 * auVar61._0_4_;
                bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
                auVar69._4_4_ = (uint)bVar9 * auVar53._4_4_ | !bVar9 * auVar61._4_4_;
                bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
                auVar69._8_4_ = (uint)bVar9 * auVar53._8_4_ | !bVar9 * auVar61._8_4_;
                bVar9 = SUB81(uVar30 >> 3,0);
                auVar69._12_4_ = (uint)bVar9 * auVar53._12_4_ | !bVar9 * auVar61._12_4_;
                auVar53 = vpshufd_avx(auVar69,0xaa);
                auVar44 = vpshufd_avx(auVar68,0xaa);
                uVar30 = vpcmpgtd_avx512vl(auVar44,auVar53);
                uVar30 = uVar30 & 0xf;
                auVar44 = vpblendmd_avx512vl(auVar68,auVar69);
                bVar9 = (bool)((byte)uVar30 & 1);
                SVar56.ptr.ptr._0_4_ = (uint)bVar9 * auVar44._0_4_ | (uint)!bVar9 * auVar53._0_4_;
                bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
                SVar56.ptr.ptr._4_4_ = (uint)bVar9 * auVar44._4_4_ | (uint)!bVar9 * auVar53._4_4_;
                bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
                SVar56.dist = (uint)bVar9 * auVar44._8_4_ | (uint)!bVar9 * auVar53._8_4_;
                bVar9 = SUB81(uVar30 >> 3,0);
                SVar56._12_4_ = (uint)bVar9 * auVar44._12_4_ | (uint)!bVar9 * auVar53._12_4_;
                auVar53 = vmovdqa32_avx512vl(auVar68);
                bVar9 = (bool)((byte)uVar30 & 1);
                SVar57.ptr.ptr._0_4_ = (uint)bVar9 * auVar53._0_4_ | !bVar9 * auVar69._0_4_;
                bVar9 = (bool)((byte)(uVar30 >> 1) & 1);
                SVar57.ptr.ptr._4_4_ = (uint)bVar9 * auVar53._4_4_ | !bVar9 * auVar69._4_4_;
                bVar9 = (bool)((byte)(uVar30 >> 2) & 1);
                SVar57.dist = (uint)bVar9 * auVar53._8_4_ | !bVar9 * auVar69._8_4_;
                bVar9 = SUB81(uVar30 >> 3,0);
                SVar57._12_4_ = (uint)bVar9 * auVar53._12_4_ | !bVar9 * auVar69._12_4_;
                *(uint *)&(local_1150->ptr).ptr =
                     (uint)bVar8 * auVar45._0_4_ | !bVar8 * auVar62._0_4_;
                *(uint *)((long)&(local_1150->ptr).ptr + 4) =
                     (uint)bVar10 * auVar45._4_4_ | !bVar10 * auVar62._4_4_;
                local_1150->dist = (uint)bVar12 * auVar45._8_4_ | !bVar12 * auVar62._8_4_;
                *(uint *)&local_1150->field_0xc =
                     (uint)bVar13 * auVar45._12_4_ | !bVar13 * auVar62._12_4_;
                local_1150[1] = SVar57;
                local_1150[2] = SVar56;
                local_1150 = local_1150 + 3;
              }
            }
          }
        }
        local_1148 = (ulong)((uint)uVar43 & 0xf) - 8;
        uVar43 = uVar43 & 0xfffffffffffffff0;
        for (local_1140 = 0; local_1140 != local_1148; local_1140 = local_1140 + 1) {
          lVar38 = local_1140 * 0x140;
          uVar85 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar77._4_4_ = uVar85;
          auVar77._0_4_ = uVar85;
          auVar77._8_4_ = uVar85;
          auVar77._12_4_ = uVar85;
          auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0x90 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + lVar38));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xa0 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x10 + lVar38));
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xb0 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x20 + lVar38));
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xc0 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x30 + lVar38));
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xd0 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x40 + lVar38));
          auVar46 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xe0 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x50 + lVar38));
          auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xf0 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x60 + lVar38));
          auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0x100 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x70 + lVar38));
          auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0x110 + lVar38),auVar77,
                                    *(undefined1 (*) [16])(uVar43 + 0x80 + lVar38));
          uVar85 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar78._4_4_ = uVar85;
          auVar78._0_4_ = uVar85;
          auVar78._8_4_ = uVar85;
          auVar78._12_4_ = uVar85;
          auVar58 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
          auVar59 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
          uVar85 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar89._4_4_ = uVar85;
          auVar89._0_4_ = uVar85;
          auVar89._8_4_ = uVar85;
          auVar89._12_4_ = uVar85;
          uVar85 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          auVar91._4_4_ = uVar85;
          auVar91._0_4_ = uVar85;
          auVar91._8_4_ = uVar85;
          auVar91._12_4_ = uVar85;
          fVar96 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar94._4_4_ = fVar96;
          auVar94._0_4_ = fVar96;
          auVar94._8_4_ = fVar96;
          auVar94._12_4_ = fVar96;
          auVar53 = vsubps_avx(auVar53,auVar78);
          auVar60 = vsubps_avx512vl(auVar44,auVar58);
          auVar61 = vsubps_avx512vl(auVar45,auVar59);
          auVar62 = vsubps_avx512vl(auVar54,auVar78);
          auVar47 = vsubps_avx512vl(auVar47,auVar58);
          auVar46 = vsubps_avx512vl(auVar46,auVar59);
          auVar63 = vsubps_avx512vl(auVar63,auVar78);
          auVar64 = vsubps_avx512vl(auVar64,auVar58);
          auVar65 = vsubps_avx512vl(auVar65,auVar59);
          auVar58 = vsubps_avx512vl(auVar63,auVar53);
          auVar59 = vsubps_avx512vl(auVar64,auVar60);
          auVar44 = vsubps_avx(auVar65,auVar61);
          auVar66 = vsubps_avx512vl(auVar53,auVar62);
          auVar67 = vsubps_avx512vl(auVar60,auVar47);
          auVar68 = vsubps_avx512vl(auVar61,auVar46);
          auVar69 = vsubps_avx512vl(auVar62,auVar63);
          auVar70 = vsubps_avx512vl(auVar47,auVar64);
          auVar45 = vsubps_avx(auVar46,auVar65);
          auVar54 = vaddps_avx512vl(auVar63,auVar53);
          auVar71 = vaddps_avx512vl(auVar64,auVar60);
          auVar72 = vaddps_avx512vl(auVar65,auVar61);
          auVar73 = vmulps_avx512vl(auVar71,auVar44);
          auVar73 = vfmsub231ps_avx512vl(auVar73,auVar59,auVar72);
          auVar72 = vmulps_avx512vl(auVar72,auVar58);
          auVar72 = vfmsub231ps_avx512vl(auVar72,auVar44,auVar54);
          auVar86._0_4_ = auVar59._0_4_ * auVar54._0_4_;
          auVar86._4_4_ = auVar59._4_4_ * auVar54._4_4_;
          auVar86._8_4_ = auVar59._8_4_ * auVar54._8_4_;
          auVar86._12_4_ = auVar59._12_4_ * auVar54._12_4_;
          auVar54 = vfmsub231ps_fma(auVar86,auVar58,auVar71);
          auVar87._0_4_ = fVar96 * auVar54._0_4_;
          auVar87._4_4_ = fVar96 * auVar54._4_4_;
          auVar87._8_4_ = fVar96 * auVar54._8_4_;
          auVar87._12_4_ = fVar96 * auVar54._12_4_;
          auVar54 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar72);
          tNear.field_0 =
               (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vfmadd231ps_avx512vl(auVar54,auVar89,auVar73);
          auVar54 = vaddps_avx512vl(auVar53,auVar62);
          auVar71 = vaddps_avx512vl(auVar60,auVar47);
          auVar72 = vaddps_avx512vl(auVar61,auVar46);
          auVar73 = vmulps_avx512vl(auVar71,auVar68);
          auVar73 = vfmsub231ps_avx512vl(auVar73,auVar67,auVar72);
          auVar72 = vmulps_avx512vl(auVar72,auVar66);
          auVar72 = vfmsub231ps_avx512vl(auVar72,auVar68,auVar54);
          auVar54 = vmulps_avx512vl(auVar54,auVar67);
          auVar54 = vfmsub231ps_avx512vl(auVar54,auVar66,auVar71);
          auVar88._0_4_ = fVar96 * auVar54._0_4_;
          auVar88._4_4_ = fVar96 * auVar54._4_4_;
          auVar88._8_4_ = fVar96 * auVar54._8_4_;
          auVar88._12_4_ = fVar96 * auVar54._12_4_;
          auVar54 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar72);
          auVar71 = vfmadd231ps_avx512vl(auVar54,auVar89,auVar73);
          auVar63 = vaddps_avx512vl(auVar62,auVar63);
          auVar47 = vaddps_avx512vl(auVar47,auVar64);
          auVar100._0_4_ = auVar46._0_4_ + auVar65._0_4_;
          auVar100._4_4_ = auVar46._4_4_ + auVar65._4_4_;
          auVar100._8_4_ = auVar46._8_4_ + auVar65._8_4_;
          auVar100._12_4_ = auVar46._12_4_ + auVar65._12_4_;
          auVar54 = vmulps_avx512vl(auVar47,auVar45);
          auVar54 = vfmsub231ps_fma(auVar54,auVar70,auVar100);
          auVar101._0_4_ = auVar100._0_4_ * auVar69._0_4_;
          auVar101._4_4_ = auVar100._4_4_ * auVar69._4_4_;
          auVar101._8_4_ = auVar100._8_4_ * auVar69._8_4_;
          auVar101._12_4_ = auVar100._12_4_ * auVar69._12_4_;
          auVar46 = vfmsub231ps_avx512vl(auVar101,auVar45,auVar63);
          auVar63 = vmulps_avx512vl(auVar63,auVar70);
          auVar47 = vfmsub231ps_avx512vl(auVar63,auVar69,auVar47);
          auVar47 = vmulps_avx512vl(auVar94,auVar47);
          auVar47 = vfmadd231ps_avx512vl(auVar47,auVar91,auVar46);
          auVar54 = vfmadd231ps_avx512vl(auVar47,auVar89,auVar54);
          auVar102._0_4_ = tNear.field_0._0_4_ + auVar71._0_4_;
          auVar102._4_4_ = tNear.field_0._4_4_ + auVar71._4_4_;
          auVar102._8_4_ = tNear.field_0._8_4_ + auVar71._8_4_;
          auVar102._12_4_ = tNear.field_0._12_4_ + auVar71._12_4_;
          auVar47 = vaddps_avx512vl(auVar54,auVar102);
          auVar21._8_4_ = 0x7fffffff;
          auVar21._0_8_ = 0x7fffffff7fffffff;
          auVar21._12_4_ = 0x7fffffff;
          auVar46 = vandps_avx512vl(auVar47,auVar21);
          auVar22._8_4_ = 0x34000000;
          auVar22._0_8_ = 0x3400000034000000;
          auVar22._12_4_ = 0x34000000;
          auVar63 = vmulps_avx512vl(auVar46,auVar22);
          auVar64 = vminps_avx512vl((undefined1  [16])tNear.field_0,auVar71);
          auVar64 = vminps_avx512vl(auVar64,auVar54);
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = 0x8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar65 = vxorps_avx512vl(auVar63,auVar23);
          uVar16 = vcmpps_avx512vl(auVar64,auVar65,5);
          auVar64 = vmaxps_avx512vl((undefined1  [16])tNear.field_0,auVar71);
          auVar54 = vmaxps_avx512vl(auVar64,auVar54);
          uVar17 = vcmpps_avx512vl(auVar54,auVar63,2);
          bVar20 = ((byte)uVar16 | (byte)uVar17) & 0xf;
          if (bVar20 != 0) {
            auVar54 = vmulps_avx512vl(auVar44,auVar67);
            auVar63 = vmulps_avx512vl(auVar58,auVar68);
            auVar64 = vmulps_avx512vl(auVar59,auVar66);
            auVar65 = vmulps_avx512vl(auVar68,auVar70);
            auVar62 = vmulps_avx512vl(auVar66,auVar45);
            auVar72 = vmulps_avx512vl(auVar67,auVar69);
            auVar59 = vfmsub213ps_avx512vl(auVar59,auVar68,auVar54);
            auVar44 = vfmsub213ps_avx512vl(auVar44,auVar66,auVar63);
            auVar58 = vfmsub213ps_avx512vl(auVar58,auVar67,auVar64);
            auVar45 = vfmsub213ps_avx512vl(auVar45,auVar67,auVar65);
            auVar67 = vfmsub213ps_avx512vl(auVar69,auVar68,auVar62);
            auVar66 = vfmsub213ps_avx512vl(auVar70,auVar66,auVar72);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar54 = vandps_avx512vl(auVar54,auVar68);
            auVar65 = vandps_avx512vl(auVar65,auVar68);
            uVar30 = vcmpps_avx512vl(auVar54,auVar65,1);
            auVar54 = vandps_avx512vl(auVar63,auVar68);
            auVar63 = vandps_avx512vl(auVar62,auVar68);
            uVar32 = vcmpps_avx512vl(auVar54,auVar63,1);
            auVar54 = vandps_avx512vl(auVar64,auVar68);
            auVar63 = vandps_avx512vl(auVar72,auVar68);
            uVar37 = vcmpps_avx512vl(auVar54,auVar63,1);
            bVar8 = (bool)((byte)uVar30 & 1);
            local_ff8._0_4_ = (uint)bVar8 * auVar59._0_4_ | (uint)!bVar8 * auVar45._0_4_;
            bVar8 = (bool)((byte)(uVar30 >> 1) & 1);
            local_ff8._4_4_ = (uint)bVar8 * auVar59._4_4_ | (uint)!bVar8 * auVar45._4_4_;
            bVar8 = (bool)((byte)(uVar30 >> 2) & 1);
            local_ff8._8_4_ = (uint)bVar8 * auVar59._8_4_ | (uint)!bVar8 * auVar45._8_4_;
            bVar8 = (bool)((byte)(uVar30 >> 3) & 1);
            local_ff8._12_4_ = (uint)bVar8 * auVar59._12_4_ | (uint)!bVar8 * auVar45._12_4_;
            bVar8 = (bool)((byte)uVar32 & 1);
            local_fe8._0_4_ = (uint)bVar8 * auVar44._0_4_ | (uint)!bVar8 * auVar67._0_4_;
            bVar8 = (bool)((byte)(uVar32 >> 1) & 1);
            local_fe8._4_4_ = (uint)bVar8 * auVar44._4_4_ | (uint)!bVar8 * auVar67._4_4_;
            bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
            local_fe8._8_4_ = (uint)bVar8 * auVar44._8_4_ | (uint)!bVar8 * auVar67._8_4_;
            bVar8 = (bool)((byte)(uVar32 >> 3) & 1);
            local_fe8._12_4_ = (uint)bVar8 * auVar44._12_4_ | (uint)!bVar8 * auVar67._12_4_;
            bVar8 = (bool)((byte)uVar37 & 1);
            local_fd8[0] = (float)((uint)bVar8 * auVar58._0_4_ | (uint)!bVar8 * auVar66._0_4_);
            bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
            local_fd8[1] = (float)((uint)bVar8 * auVar58._4_4_ | (uint)!bVar8 * auVar66._4_4_);
            bVar8 = (bool)((byte)(uVar37 >> 2) & 1);
            local_fd8[2] = (float)((uint)bVar8 * auVar58._8_4_ | (uint)!bVar8 * auVar66._8_4_);
            bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
            local_fd8[3] = (float)((uint)bVar8 * auVar58._12_4_ | (uint)!bVar8 * auVar66._12_4_);
            auVar95._0_4_ = fVar96 * local_fd8[0];
            auVar95._4_4_ = fVar96 * local_fd8[1];
            auVar95._8_4_ = fVar96 * local_fd8[2];
            auVar95._12_4_ = fVar96 * local_fd8[3];
            auVar44 = vfmadd213ps_fma(auVar91,local_fe8,auVar95);
            auVar44 = vfmadd213ps_fma(auVar89,local_ff8,auVar44);
            auVar90._0_4_ = auVar44._0_4_ + auVar44._0_4_;
            auVar90._4_4_ = auVar44._4_4_ + auVar44._4_4_;
            auVar90._8_4_ = auVar44._8_4_ + auVar44._8_4_;
            auVar90._12_4_ = auVar44._12_4_ + auVar44._12_4_;
            auVar92._0_4_ = auVar61._0_4_ * local_fd8[0];
            auVar92._4_4_ = auVar61._4_4_ * local_fd8[1];
            auVar92._8_4_ = auVar61._8_4_ * local_fd8[2];
            auVar92._12_4_ = auVar61._12_4_ * local_fd8[3];
            auVar44 = vfmadd213ps_fma(auVar60,local_fe8,auVar92);
            auVar44 = vfmadd213ps_fma(auVar53,local_ff8,auVar44);
            auVar53 = vrcp14ps_avx512vl(auVar90);
            auVar54 = auVar105._0_16_;
            auVar45 = vfnmadd213ps_avx512vl(auVar53,auVar90,auVar54);
            auVar53 = vfmadd132ps_fma(auVar45,auVar53,auVar53);
            local_1008._0_4_ = auVar53._0_4_ * (auVar44._0_4_ + auVar44._0_4_);
            local_1008._4_4_ = auVar53._4_4_ * (auVar44._4_4_ + auVar44._4_4_);
            local_1008._8_4_ = auVar53._8_4_ * (auVar44._8_4_ + auVar44._8_4_);
            local_1008._12_4_ = auVar53._12_4_ * (auVar44._12_4_ + auVar44._12_4_);
            auVar83 = ZEXT1664(local_1008);
            uVar85 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar24._4_4_ = uVar85;
            auVar24._0_4_ = uVar85;
            auVar24._8_4_ = uVar85;
            auVar24._12_4_ = uVar85;
            uVar16 = vcmpps_avx512vl(local_1008,auVar24,0xd);
            auVar25._8_4_ = 0x80000000;
            auVar25._0_8_ = 0x8000000080000000;
            auVar25._12_4_ = 0x80000000;
            auVar53 = vxorps_avx512vl(auVar90,auVar25);
            fVar96 = (ray->super_RayK<1>).tfar;
            auVar26._4_4_ = fVar96;
            auVar26._0_4_ = fVar96;
            auVar26._8_4_ = fVar96;
            auVar26._12_4_ = fVar96;
            uVar17 = vcmpps_avx512vl(local_1008,auVar26,2);
            uVar18 = vcmpps_avx512vl(auVar90,auVar53,4);
            bVar20 = (byte)uVar16 & (byte)uVar17 & (byte)uVar18 & bVar20;
            if (bVar20 != 0) {
              auVar3._0_4_ = (ray->super_RayK<1>).tfar;
              auVar3._4_4_ = (ray->super_RayK<1>).mask;
              auVar3._8_4_ = (ray->super_RayK<1>).id;
              auVar3._12_4_ = (ray->super_RayK<1>).flags;
              auVar84 = ZEXT1664(auVar3);
              uVar31 = vextractps_avx(auVar3,1);
              lVar38 = lVar38 + uVar43;
              auVar27._8_4_ = 0x219392ef;
              auVar27._0_8_ = 0x219392ef219392ef;
              auVar27._12_4_ = 0x219392ef;
              uVar30 = vcmpps_avx512vl(auVar46,auVar27,5);
              auVar53 = vrcp14ps_avx512vl(auVar47);
              auVar44 = vfnmadd213ps_avx512vl(auVar47,auVar53,auVar54);
              auVar53 = vfmadd132ps_avx512vl(auVar44,auVar53,auVar53);
              fVar96 = (float)((uint)((byte)uVar30 & 1) * auVar53._0_4_);
              fVar97 = (float)((uint)((byte)(uVar30 >> 1) & 1) * auVar53._4_4_);
              fVar98 = (float)((uint)((byte)(uVar30 >> 2) & 1) * auVar53._8_4_);
              fVar76 = (float)((uint)((byte)(uVar30 >> 3) & 1) * auVar53._12_4_);
              auVar79._0_4_ = fVar96 * tNear.field_0._0_4_;
              auVar79._4_4_ = fVar97 * tNear.field_0._4_4_;
              auVar79._8_4_ = fVar98 * tNear.field_0._8_4_;
              auVar79._12_4_ = fVar76 * tNear.field_0._12_4_;
              local_1028 = vminps_avx512vl(auVar79,auVar54);
              auVar80._0_4_ = fVar96 * auVar71._0_4_;
              auVar80._4_4_ = fVar97 * auVar71._4_4_;
              auVar80._8_4_ = fVar98 * auVar71._8_4_;
              auVar80._12_4_ = fVar76 * auVar71._12_4_;
              local_1018 = vminps_avx512vl(auVar80,auVar54);
              pSVar5 = context->scene;
              auVar81._8_4_ = 0x7f800000;
              auVar81._0_8_ = 0x7f8000007f800000;
              auVar81._12_4_ = 0x7f800000;
              auVar53 = vblendmps_avx512vl(auVar81,local_1008);
              auVar74._0_4_ =
                   (uint)(bVar20 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar20 & 1) * 0x7f800000;
              bVar8 = (bool)(bVar20 >> 1 & 1);
              auVar74._4_4_ = (uint)bVar8 * auVar53._4_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar20 >> 2 & 1);
              auVar74._8_4_ = (uint)bVar8 * auVar53._8_4_ | (uint)!bVar8 * 0x7f800000;
              auVar74._12_4_ =
                   (uint)(bVar20 >> 3) * auVar53._12_4_ | (uint)!(bool)(bVar20 >> 3) * 0x7f800000;
              auVar53 = vshufps_avx(auVar74,auVar74,0xb1);
              auVar53 = vminps_avx(auVar53,auVar74);
              auVar44 = vshufpd_avx(auVar53,auVar53,1);
              auVar53 = vminps_avx(auVar44,auVar53);
              uVar16 = vcmpps_avx512vl(auVar74,auVar53,0);
              bVar19 = bVar20;
              if (((byte)uVar16 & bVar20) != 0) {
                bVar19 = (byte)uVar16 & bVar20;
              }
              uVar34 = 0;
              for (uVar36 = (uint)bVar19; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
                uVar34 = uVar34 + 1;
              }
              do {
                uVar36 = uVar34 & 0xff;
                h.geomID = *(uint *)(lVar38 + 0x120 + (ulong)uVar36 * 4);
                pGVar6 = (pSVar5->geometries).items[h.geomID].ptr;
                if ((pGVar6->mask & uVar31) == 0) {
                  bVar20 = ~(byte)(1 << (uVar34 & 0x1f)) & bVar20;
                }
                else {
                  pRVar7 = context->args;
                  if (pRVar7->filter == (RTCFilterFunctionN)0x0) {
                    args.context = context->user;
                    if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      uVar30 = (ulong)(uVar36 << 2);
                      fVar96 = *(float *)(local_1028 + uVar30);
                      fVar97 = *(float *)(local_1018 + uVar30);
                      (ray->super_RayK<1>).tfar = *(float *)(local_1008 + uVar30);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_ff8 + uVar30);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_fe8 + uVar30);
                      (ray->Ng).field_0.field_0.z = *(float *)((long)local_fd8 + uVar30);
                      ray->u = fVar96;
                      ray->v = fVar97;
                      ray->primID = *(uint *)(lVar38 + 0x130 + uVar30);
                      ray->geomID = h.geomID;
                      ray->instID[0] = (args.context)->instID[0];
                      ray->instPrimID[0] = (args.context)->instPrimID[0];
                      break;
                    }
                  }
                  else {
                    args.context = context->user;
                  }
                  uVar30 = (ulong)(uVar36 * 4);
                  h.Ng.field_0.field_0.x = *(float *)(local_ff8 + uVar30);
                  h.Ng.field_0.field_0.y = *(float *)(local_fe8 + uVar30);
                  h.Ng.field_0.field_0.z = *(float *)((long)local_fd8 + uVar30);
                  h.u = *(float *)(local_1028 + uVar30);
                  h.v = *(float *)(local_1018 + uVar30);
                  h.primID = *(uint *)(lVar38 + 0x130 + uVar30);
                  h.instID[0] = (args.context)->instID[0];
                  h.instPrimID[0] = (args.context)->instPrimID[0];
                  (ray->super_RayK<1>).tfar = *(float *)(local_1008 + uVar30);
                  local_116c = -1;
                  args.valid = &local_116c;
                  args.geometryUserPtr = pGVar6->userPtr;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)&h;
                  args.N = 1;
                  auVar53 = auVar83._0_16_;
                  local_1158 = (ulong)uVar36;
                  if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01bd9f78:
                    if ((pRVar7->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar7->filter)(&args);
                      uVar36 = (uint)local_1158;
                      auVar83 = ZEXT1664(auVar53);
                      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar105 = ZEXT1664(auVar44);
                      uVar39 = local_1160;
                      uVar40 = local_1168;
                      if (*args.valid == 0) goto LAB_01bda056;
                    }
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
                    *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
                  }
                  else {
                    (*pGVar6->intersectionFilterN)(&args);
                    uVar36 = (uint)local_1158;
                    auVar83 = ZEXT1664(auVar53);
                    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar105 = ZEXT1664(auVar44);
                    uVar39 = local_1160;
                    uVar40 = local_1168;
                    if (*args.valid != 0) goto LAB_01bd9f78;
LAB_01bda056:
                    auVar83 = ZEXT1664(auVar53);
                    local_1088 = auVar84._0_4_;
                    (ray->super_RayK<1>).tfar = local_1088;
                    uVar39 = local_1160;
                    uVar40 = local_1168;
                  }
                  auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                  auVar4._4_4_ = (ray->super_RayK<1>).mask;
                  auVar4._8_4_ = (ray->super_RayK<1>).id;
                  auVar4._12_4_ = (ray->super_RayK<1>).flags;
                  auVar84 = ZEXT1664(auVar4);
                  fVar96 = (ray->super_RayK<1>).tfar;
                  auVar28._4_4_ = fVar96;
                  auVar28._0_4_ = fVar96;
                  auVar28._8_4_ = fVar96;
                  auVar28._12_4_ = fVar96;
                  uVar16 = vcmpps_avx512vl(auVar83._0_16_,auVar28,2);
                  bVar20 = ~(byte)(1 << (uVar36 & 0x1f)) & bVar20 & (byte)uVar16;
                  uVar31 = vextractps_avx(auVar4,1);
                }
                if (bVar20 == 0) break;
                auVar82._8_4_ = 0x7f800000;
                auVar82._0_8_ = 0x7f8000007f800000;
                auVar82._12_4_ = 0x7f800000;
                auVar53 = vblendmps_avx512vl(auVar82,auVar83._0_16_);
                auVar75._0_4_ =
                     (uint)(bVar20 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar20 & 1) * 0x7f800000;
                bVar8 = (bool)(bVar20 >> 1 & 1);
                auVar75._4_4_ = (uint)bVar8 * auVar53._4_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(bVar20 >> 2 & 1);
                auVar75._8_4_ = (uint)bVar8 * auVar53._8_4_ | (uint)!bVar8 * 0x7f800000;
                auVar75._12_4_ =
                     (uint)(bVar20 >> 3) * auVar53._12_4_ | (uint)!(bool)(bVar20 >> 3) * 0x7f800000;
                auVar53 = vshufps_avx(auVar75,auVar75,0xb1);
                auVar53 = vminps_avx(auVar53,auVar75);
                auVar44 = vshufpd_avx(auVar53,auVar53,1);
                auVar53 = vminps_avx(auVar44,auVar53);
                uVar16 = vcmpps_avx512vl(auVar75,auVar53,0);
                bVar33 = (byte)uVar16 & bVar20;
                bVar19 = bVar20;
                if (bVar33 != 0) {
                  bVar19 = bVar33;
                }
                uVar34 = 0;
                for (uVar36 = (uint)bVar19; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
                  uVar34 = uVar34 + 1;
                }
              } while( true );
            }
          }
          auVar93 = ZEXT1664(local_f88);
          auVar99 = ZEXT1664(local_fa8);
          auVar103 = ZEXT1664(local_fb8);
          auVar104 = ZEXT1664(local_fc8);
          fVar76 = local_f98;
          fVar96 = fStack_f94;
          fVar97 = fStack_f90;
          fVar98 = fStack_f8c;
        }
        fVar1 = (ray->super_RayK<1>).tfar;
        auVar83 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
        auVar84 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_01bd953c;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }